

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Vec_Wec_t * Gia_ManCreateNodeSupps(Gia_Man_t *p,Vec_Int_t *vNodes,int fVerbose)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *pVVar6;
  int *__ptr;
  void *pvVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  timespec ts;
  long local_58;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    local_58 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_58 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar3 = vNodes->nSize;
  pVVar5 = (Vec_Wec_t *)malloc(0x10);
  iVar9 = iVar3;
  if (iVar3 - 1U < 7) {
    iVar9 = 8;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar9;
  if (iVar9 == 0) {
    pVVar6 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar6 = (Vec_Int_t *)calloc((long)iVar9,0x10);
  }
  pVVar5->pArray = pVVar6;
  pVVar5->nSize = iVar3;
  iVar3 = p->nObjs;
  __ptr = (int *)malloc(0x10);
  iVar9 = 8;
  if (6 < iVar3 - 1U) {
    iVar9 = iVar3;
  }
  __ptr[1] = 0;
  *__ptr = iVar9;
  if (iVar9 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = calloc((long)iVar9,0x10);
  }
  *(void **)(__ptr + 2) = pvVar7;
  __ptr[1] = iVar3;
  pVVar6 = p->vCis;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      iVar9 = pVVar6->pArray[lVar11];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_001f1de8;
      if (iVar9 == 0) break;
      if (iVar3 <= iVar9) goto LAB_001f1dc9;
      Vec_IntPush((Vec_Int_t *)((long)iVar9 * 0x10 + (long)pvVar7),(int)lVar11);
      lVar11 = lVar11 + 1;
      pVVar6 = p->vCis;
    } while (lVar11 < pVVar6->nSize);
  }
  if (0 < p->nObjs) {
    lVar11 = 0;
    lVar12 = 0;
    lVar13 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar1 = *(undefined8 *)(&p->pObjs->field_0x0 + lVar12);
      uVar4 = (uint)uVar1;
      if ((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) {
        uVar10 = (ulong)-(uVar4 & 0x1fffffff) + lVar13;
        iVar3 = (int)uVar10;
        if (iVar3 < 0) goto LAB_001f1dc9;
        iVar9 = __ptr[1];
        if (iVar9 <= iVar3) goto LAB_001f1dc9;
        uVar8 = (ulong)-((uint)((ulong)uVar1 >> 0x20) & 0x1fffffff) + lVar13;
        iVar3 = (int)uVar8;
        if (((iVar3 < 0) || (iVar9 <= iVar3)) || (iVar9 <= lVar13)) goto LAB_001f1dc9;
        lVar2 = *(long *)(__ptr + 2);
        Vec_IntTwoMerge2((Vec_Int_t *)((uVar10 & 0xffffffff) * 0x10 + lVar2),
                         (Vec_Int_t *)((uVar8 & 0xffffffff) * 0x10 + lVar2),
                         (Vec_Int_t *)(lVar2 + lVar11));
      }
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0xc;
      lVar11 = lVar11 + 0x10;
    } while (lVar13 < p->nObjs);
  }
  if (0 < vNodes->nSize) {
    lVar11 = 0;
    do {
      iVar3 = vNodes->pArray[lVar11];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_001f1de8:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((pVVar5->nSize <= lVar11) || (__ptr[1] <= iVar3)) {
LAB_001f1dc9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar12 = (long)iVar3 * 0x10;
      if (0 < *(int *)(*(long *)(__ptr + 2) + 4 + lVar12)) {
        pVVar6 = pVVar5->pArray;
        lVar12 = *(long *)(__ptr + 2) + lVar12;
        lVar13 = 0;
        do {
          Vec_IntPush(pVVar6 + lVar11,*(int *)(*(long *)(lVar12 + 8) + lVar13 * 4));
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)(lVar12 + 4));
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < vNodes->nSize);
  }
  iVar3 = *__ptr;
  if (0 < (long)iVar3) {
    lVar11 = *(long *)(__ptr + 2);
    lVar12 = 0;
    do {
      pvVar7 = *(void **)(lVar11 + 8 + lVar12);
      if (pvVar7 != (void *)0x0) {
        free(pvVar7);
        *(undefined8 *)(lVar11 + 8 + lVar12) = 0;
      }
      lVar12 = lVar12 + 0x10;
    } while ((long)iVar3 * 0x10 != lVar12);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  __ptr[0] = 0;
  __ptr[1] = 0;
  free(__ptr);
  if (fVerbose != 0) {
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(1,"%s =","Support computation");
    Abc_Print(1,"%9.2f sec\n",(double)(lVar11 + local_58) / 1000000.0);
  }
  return pVVar5;
}

Assistant:

Vec_Wec_t * Gia_ManCreateNodeSupps( Gia_Man_t * p, Vec_Int_t * vNodes, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; int i, Id;
    Vec_Wec_t * vSuppsNo = Vec_WecStart( Vec_IntSize(vNodes) );
    Vec_Wec_t * vSupps = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Id), i );
    Gia_ManForEachAnd( p, pObj, Id )
        Vec_IntTwoMerge2( Vec_WecEntry(vSupps, Gia_ObjFaninId0(pObj, Id)), 
                          Vec_WecEntry(vSupps, Gia_ObjFaninId1(pObj, Id)), 
                          Vec_WecEntry(vSupps, Id) ); 
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Vec_IntAppend( Vec_WecEntry(vSuppsNo, i), Vec_WecEntry(vSupps, Gia_ObjId(p, pObj)) );
    Vec_WecFree( vSupps );
    if ( fVerbose )
        Abc_PrintTime( 1, "Support computation", Abc_Clock() - clk );
    return vSuppsNo;
}